

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O0

uint8_t * MuxImageEmit(WebPMuxImage *wpi,uint8_t *dst)

{
  WebPMuxImage *in_RSI;
  long *in_RDI;
  WebPChunk *unaff_retaddr;
  uint8_t *in_stack_ffffffffffffffe8;
  
  if (*in_RDI != 0) {
    in_stack_ffffffffffffffe8 = (uint8_t *)*in_RDI;
    MuxImageDiskSize(in_RSI);
    in_RSI = (WebPMuxImage *)ChunkEmitSpecial((WebPChunk *)wpi,(size_t)dst,(uint8_t *)unaff_retaddr)
    ;
  }
  if (in_RDI[1] != 0) {
    in_RSI = (WebPMuxImage *)ChunkEmit(unaff_retaddr,(uint8_t *)in_RDI);
  }
  if (in_RDI[2] != 0) {
    in_RSI = (WebPMuxImage *)ChunkEmit(unaff_retaddr,(uint8_t *)in_RDI);
  }
  if (in_RDI[3] != 0) {
    in_RSI = (WebPMuxImage *)ChunkListEmit((WebPChunk *)in_RSI,in_stack_ffffffffffffffe8);
  }
  return (uint8_t *)in_RSI;
}

Assistant:

uint8_t* MuxImageEmit(const WebPMuxImage* const wpi, uint8_t* dst) {
  // Ordering of chunks to be emitted is strictly as follows:
  // 1. ANMF chunk (if present).
  // 2. ALPH chunk (if present).
  // 3. VP8/VP8L chunk.
  assert(wpi);
  if (wpi->header != NULL) {
    dst = ChunkEmitSpecial(wpi->header, MuxImageDiskSize(wpi), dst);
  }
  if (wpi->alpha != NULL) dst = ChunkEmit(wpi->alpha, dst);
  if (wpi->img != NULL) dst = ChunkEmit(wpi->img, dst);
  if (wpi->unknown != NULL) dst = ChunkListEmit(wpi->unknown, dst);
  return dst;
}